

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# AppleII.cpp
# Opt level: O3

void __thiscall
anon_unknown.dwarf_8366dc::StretchedAYPair::apply_samples<(Outputs::Speaker::Action)1>
          (StretchedAYPair *this,size_t number_of_samples,StereoSample *target)

{
  undefined1 *this_00;
  type tVar1;
  type tVar2;
  int iVar3;
  uint uVar4;
  StereoSample SVar5;
  size_t sVar6;
  
  if (number_of_samples != 0) {
    this_00 = &(this->super_AYPair).field_0x1150;
    sVar6 = 0;
    do {
      iVar3 = this->subdivider_ + 1;
      this->subdivider_ = iVar3;
      if (iVar3 == 0x1c) {
        uVar4 = this->phase_ + 1;
        this->phase_ = uVar4;
        this->subdivider_ = -(uint)((uVar4 & 0xf) == 0);
        if (uVar4 == 0x41) {
          this->phase_ = 0;
        }
        GI::AY38910::AY38910SampleSource<false>::advance((AY38910SampleSource<false> *)this);
        GI::AY38910::AY38910SampleSource<false>::advance((AY38910SampleSource<false> *)this_00);
      }
      tVar1 = GI::AY38910::AY38910SampleSource<false>::level((AY38910SampleSource<false> *)this);
      tVar2 = GI::AY38910::AY38910SampleSource<false>::level((AY38910SampleSource<false> *)this_00);
      SVar5.right = tVar2;
      SVar5.left = tVar1;
      target[sVar6] = SVar5;
      sVar6 = sVar6 + 1;
    } while (number_of_samples != sVar6);
  }
  return;
}

Assistant:

void apply_samples(std::size_t number_of_samples, Outputs::Speaker::StereoSample *target) {

			// (1) take 64 windows of 7 input cycles followed by one window of 8 input cycles;
			// (2) after each four windows, advance the underlying AY.
			//
			// i.e. advance after:
			//
			//	* 28 cycles, {16 times, then 15 times, then 15 times, then 15 times};
			//	* 29 cycles, once.
			//
			// so:
			//	16, 1;	15, 1;	15, 1;	15, 1
			//
			// i.e. add an extra one on the 17th, 33rd, 49th and 65th ticks in a 65-tick loop.
			for(std::size_t c = 0; c < number_of_samples; c++) {
				++subdivider_;
				if(subdivider_ == 28) {
					++phase_;
					subdivider_ = (phase_ & 15) ? 0 : -1;
					if(phase_ == 65) phase_ = 0;

					advance();
				}

				target[c] = level();
			}
		}